

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O1

void __thiscall
duckdb::StringValueScanner::StringValueScanner
          (StringValueScanner *this,shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager,
          shared_ptr<duckdb::CSVStateMachine,_true> *state_machine,
          shared_ptr<duckdb::CSVErrorHandler,_true> *error_handler,idx_t result_size,
          CSVIterator *boundary)

{
  bool store_line_size_p;
  bool sniffing_p;
  idx_t buffer_position;
  type pCVar1;
  CSVBufferManager *pCVar2;
  pointer pCVar3;
  CSVStateMachine *pCVar4;
  shared_ptr<duckdb::CSVFileScan,_true> local_c8;
  shared_ptr<duckdb::CSVErrorHandler,_true> local_b8;
  shared_ptr<duckdb::CSVStateMachine,_true> local_a8;
  shared_ptr<duckdb::CSVBufferManager,_true> local_98;
  StringValueResult *local_88;
  type local_80;
  Allocator *local_78;
  type local_70;
  shared_ptr<duckdb::CSVFileScan,_true> local_68;
  string local_50;
  
  local_98.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (buffer_manager->internal).
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (buffer_manager->internal).
       super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_98.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_a8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (state_machine->internal).
       super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (state_machine->internal).
       super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.internal.
            super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.internal.
            super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_b8.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (error_handler->internal).
       super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b8.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (error_handler->internal).
       super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_b8.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_b8.internal.
            super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_b8.internal.
            super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_68.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BaseScanner::BaseScanner
            (&this->super_BaseScanner,&local_98,&local_a8,&local_b8,false,&local_68,boundary);
  if (local_68.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_b8.internal.super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.internal.
               super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.internal.super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.internal.
               super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.internal.
               super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_BaseScanner)._vptr_BaseScanner = (_func_int **)&PTR__StringValueScanner_019cc970;
  this->scanner_idx = 0;
  (this->buffer_tracker).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer_tracker).internal.
  super___shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*(state_machine);
  local_78 = Allocator::DefaultAllocator();
  buffer_position = (this->super_BaseScanner).iterator.pos.buffer_pos;
  pCVar1 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator*(error_handler);
  pCVar2 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  pCVar3 = unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>,_true>::operator->
                     (&pCVar2->context->client_data);
  store_line_size_p = pCVar3->debug_set_max_line_length;
  local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_BaseScanner).csv_file_scan.internal.
       super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->super_BaseScanner).csv_file_scan.internal.
          super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  sniffing_p = (this->super_BaseScanner).sniffing;
  local_80 = pCVar1;
  pCVar2 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(buffer_manager);
  CSVBufferManager::GetFilePath_abi_cxx11_(&local_50,pCVar2);
  local_88 = &this->result;
  StringValueResult::StringValueResult
            (local_88,&(this->super_BaseScanner).states,local_70,
             &(this->super_BaseScanner).cur_buffer_handle,local_78,result_size,buffer_position,
             local_80,&(this->super_BaseScanner).iterator,store_line_size_p,&local_c8,
             &(this->super_BaseScanner).lines_read,sniffing_p,&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.internal.super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->state_machine_strict).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->state_machine_strict).internal.
  super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->previous_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->previous_buffer_handle).internal.
  super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->start_pos = 0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar4 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(state_machine);
  (this->super_BaseScanner).iterator.buffer_size = (pCVar4->options->buffer_size_option).value;
  return;
}

Assistant:

StringValueScanner::StringValueScanner(const shared_ptr<CSVBufferManager> &buffer_manager,
                                       const shared_ptr<CSVStateMachine> &state_machine,
                                       const shared_ptr<CSVErrorHandler> &error_handler, idx_t result_size,
                                       const CSVIterator &boundary)
    : BaseScanner(buffer_manager, state_machine, error_handler, false, nullptr, boundary), scanner_idx(0),
      result(states, *state_machine, cur_buffer_handle, Allocator::DefaultAllocator(), result_size,
             iterator.pos.buffer_pos, *error_handler, iterator,
             buffer_manager->context.client_data->debug_set_max_line_length, csv_file_scan, lines_read, sniffing,
             buffer_manager->GetFilePath(), 0),
      start_pos(0) {
	iterator.buffer_size = state_machine->options.buffer_size_option.GetValue();
}